

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O2

bool __thiscall
icu_63::double_conversion::Bignum::ToHexString(Bignum *this,char *buffer,int buffer_size)

{
  uint *puVar1;
  int i;
  uint uVar2;
  int iVar3;
  int iVar4;
  char cVar5;
  char *pcVar6;
  int i_1;
  long lVar7;
  long lVar8;
  
  iVar3 = this->used_digits_;
  if ((long)iVar3 == 0) {
    if (1 < buffer_size) {
      buffer[0] = '0';
      buffer[1] = '\0';
      return true;
    }
  }
  else {
    iVar4 = (this->exponent_ + iVar3) * 7 + -8;
    for (uVar2 = (this->bigits_).start_[(long)iVar3 + -1]; uVar2 != 0; uVar2 = uVar2 >> 4) {
      iVar4 = iVar4 + 1;
    }
    iVar3 = 0;
    if (iVar4 + 1 < buffer_size) {
      buffer[iVar4 + 1] = '\0';
      for (; iVar3 < this->exponent_; iVar3 = iVar3 + 1) {
        for (lVar7 = 0; (int)lVar7 != -7; lVar7 = lVar7 + -1) {
          buffer[lVar7 + iVar4] = '0';
        }
        iVar4 = iVar4 + -7;
      }
      lVar7 = 0;
      while( true ) {
        puVar1 = (this->bigits_).start_;
        if ((long)this->used_digits_ + -1 <= lVar7) break;
        uVar2 = puVar1[lVar7];
        for (lVar8 = 0; (int)lVar8 != -7; lVar8 = lVar8 + -1) {
          cVar5 = '7';
          if ((uVar2 & 0xf) < 10) {
            cVar5 = '0';
          }
          buffer[lVar8 + iVar4] = cVar5 + (char)(uVar2 & 0xf);
          uVar2 = uVar2 >> 4;
        }
        iVar4 = iVar4 + -7;
        lVar7 = lVar7 + 1;
      }
      pcVar6 = buffer + iVar4;
      for (uVar2 = puVar1[(long)this->used_digits_ + -1]; uVar2 != 0; uVar2 = uVar2 >> 4) {
        cVar5 = '7';
        if ((uVar2 & 0xf) < 10) {
          cVar5 = '0';
        }
        *pcVar6 = cVar5 + (char)(uVar2 & 0xf);
        pcVar6 = pcVar6 + -1;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool Bignum::ToHexString(char* buffer, int buffer_size) const {
  ASSERT(IsClamped());
  // Each bigit must be printable as separate hex-character.
  ASSERT(kBigitSize % 4 == 0);
  const int kHexCharsPerBigit = kBigitSize / 4;

  if (used_digits_ == 0) {
    if (buffer_size < 2) return false;
    buffer[0] = '0';
    buffer[1] = '\0';
    return true;
  }
  // We add 1 for the terminating '\0' character.
  int needed_chars = (BigitLength() - 1) * kHexCharsPerBigit +
      SizeInHexChars(bigits_[used_digits_ - 1]) + 1;
  if (needed_chars > buffer_size) return false;
  int string_index = needed_chars - 1;
  buffer[string_index--] = '\0';
  for (int i = 0; i < exponent_; ++i) {
    for (int j = 0; j < kHexCharsPerBigit; ++j) {
      buffer[string_index--] = '0';
    }
  }
  for (int i = 0; i < used_digits_ - 1; ++i) {
    Chunk current_bigit = bigits_[i];
    for (int j = 0; j < kHexCharsPerBigit; ++j) {
      buffer[string_index--] = HexCharOfValue(current_bigit & 0xF);
      current_bigit >>= 4;
    }
  }
  // And finally the last bigit.
  Chunk most_significant_bigit = bigits_[used_digits_ - 1];
  while (most_significant_bigit != 0) {
    buffer[string_index--] = HexCharOfValue(most_significant_bigit & 0xF);
    most_significant_bigit >>= 4;
  }
  return true;
}